

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  char_t *local_48;
  char_t *end_1;
  char_t *end;
  char_t ss;
  char_t *begin;
  gap g;
  char_t *s_local;
  
  g.size = (size_t)s;
  gap::gap((gap *)&begin);
  sVar1 = g.size;
  do {
    while (((anonymous_namespace)::chartype_table[*(byte *)g.size] & 1) != 0) {
LAB_00160a69:
      if (*(char *)g.size == '<') {
        end_1 = gap::flush((gap *)&begin,(char_t *)g.size);
        while( true ) {
          bVar3 = false;
          if (sVar1 < end_1) {
            bVar3 = ((anonymous_namespace)::chartype_table[end_1[-1]] & 8) != 0;
          }
          if (!bVar3) break;
          end_1 = end_1 + -1;
        }
        *end_1 = '\0';
        return (char_t *)(g.size + 1);
      }
      if (*(char *)g.size == '\r') {
        pcVar2 = (char *)(g.size + 1);
        *(undefined1 *)g.size = 10;
        g.size = (size_t)pcVar2;
        if (*pcVar2 == '\n') {
          gap::push((gap *)&begin,(char_t **)&g.size,1);
        }
      }
      else if (*(char *)g.size == '&') {
        g.size = (size_t)strconv_escape((char_t *)g.size,(gap *)&begin);
      }
      else {
        if (*(char *)g.size == '\0') {
          local_48 = gap::flush((gap *)&begin,(char_t *)g.size);
          while( true ) {
            bVar3 = false;
            if (sVar1 < local_48) {
              bVar3 = ((anonymous_namespace)::chartype_table[local_48[-1]] & 8) != 0;
            }
            if (!bVar3) break;
            local_48 = local_48 + -1;
          }
          *local_48 = '\0';
          return (char_t *)g.size;
        }
        g.size = g.size + 1;
      }
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 1)] & 1) != 0) {
      g.size = g.size + 1;
      goto LAB_00160a69;
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 2)] & 1) != 0) {
      g.size = g.size + 2;
      goto LAB_00160a69;
    }
    if (((anonymous_namespace)::chartype_table[*(byte *)(g.size + 3)] & 1) != 0) {
      g.size = g.size + 3;
      goto LAB_00160a69;
    }
    g.size = g.size + 4;
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI__IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}